

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Parameters * __thiscall minja::Parser::parseParameters_abi_cxx11_(Parser *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  runtime_error *prVar4;
  undefined8 in_RSI;
  Parameters *in_RDI;
  shared_ptr<minja::Expression> value;
  VariableExpr *ident;
  shared_ptr<minja::Expression> expr;
  Parameters *result;
  VariableExpr *in_stack_fffffffffffffd38;
  shared_ptr<minja::Expression> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd57;
  string *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  byte in_stack_fffffffffffffd87;
  long local_270;
  string *token;
  Parser *in_stack_fffffffffffffde8;
  string local_210 [23];
  undefined1 in_stack_fffffffffffffe07;
  Parser *in_stack_fffffffffffffe08;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  undefined8 local_168;
  string local_160 [32];
  string local_140 [32];
  __shared_ptr local_120 [23];
  allocator<char> local_109;
  string local_108 [32];
  string local_e8 [32];
  long local_c8;
  __shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> local_c0;
  int local_b0;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [35];
  byte local_65;
  undefined1 local_51 [33];
  string local_30 [48];
  
  consumeSpaces((Parser *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                (SpaceHandling)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  token = (string *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
             ,(allocator<char> *)in_stack_fffffffffffffd70);
  consumeToken(in_stack_fffffffffffffde8,token,(SpaceHandling)((ulong)in_RSI >> 0x20));
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  if ((bVar1 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected opening parenthesis in param list");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_65 = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
            *)0x2ebb3b);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd38);
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Expected closing parenthesis in call args");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78,(allocator<char> *)in_stack_fffffffffffffd70);
    consumeToken(in_stack_fffffffffffffde8,token,(SpaceHandling)((ulong)in_RSI >> 0x20));
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_65 = 1;
      local_b0 = 1;
      break;
    }
    parseExpression(in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_c0);
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Expected expression in call args");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar3 = std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get(&local_c0);
    if (peVar3 == (element_type *)0x0) {
      local_270 = 0;
    }
    else {
      local_270 = __dynamic_cast(peVar3,&Expression::typeinfo,&VariableExpr::typeinfo,0);
    }
    local_c8 = local_270;
    if (local_270 == 0) {
      in_stack_fffffffffffffd70 = local_188;
      std::__cxx11::string::string(in_stack_fffffffffffffd70);
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::__cxx11::string::~string(local_188);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78,(allocator<char> *)in_stack_fffffffffffffd70);
      consumeToken(in_stack_fffffffffffffde8,token,(SpaceHandling)((ulong)in_RSI >> 0x20));
      in_stack_fffffffffffffd87 = std::__cxx11::string::empty();
      in_stack_fffffffffffffd87 = in_stack_fffffffffffffd87 ^ 0xff;
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      if ((in_stack_fffffffffffffd87 & 1) == 0) {
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffd38);
        local_168 = 0;
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
        ::emplace_back<std::__cxx11::string,decltype(nullptr)>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48,(void **)in_stack_fffffffffffffd40);
        std::__cxx11::string::~string(local_160);
      }
      else {
        parseExpression(in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_120);
        if (!bVar2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Expected expression in for named arg");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffd38);
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
        ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::__cxx11::string::~string(local_140);
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ebf53);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78,(allocator<char> *)in_stack_fffffffffffffd70);
    consumeToken(in_stack_fffffffffffffde8,token,(SpaceHandling)((ulong)in_RSI >> 0x20));
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    if ((bVar1 & 1) == 0) {
      local_b0 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78,(allocator<char> *)in_stack_fffffffffffffd70);
      consumeToken(in_stack_fffffffffffffde8,token,(SpaceHandling)((ulong)in_RSI >> 0x20));
      in_stack_fffffffffffffd57 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
      if ((in_stack_fffffffffffffd57 & 1) != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Expected closing parenthesis in call args");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_65 = 1;
      local_b0 = 1;
    }
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ec2af);
  } while (local_b0 == 0);
  if ((local_65 & 1) == 0) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  }
  return in_RDI;
}

Assistant:

Expression::Parameters parseParameters() {
        consumeSpaces();
        if (consumeToken("(").empty()) throw std::runtime_error("Expected opening parenthesis in param list");

        Expression::Parameters result;

        while (it != end) {
            if (!consumeToken(")").empty()) {
                return result;
            }
            auto expr = parseExpression();
            if (!expr) throw std::runtime_error("Expected expression in call args");

            if (auto ident = dynamic_cast<VariableExpr*>(expr.get())) {
                if (!consumeToken("=").empty()) {
                    auto value = parseExpression();
                    if (!value) throw std::runtime_error("Expected expression in for named arg");
                    result.emplace_back(ident->get_name(), std::move(value));
                } else {
                    result.emplace_back(ident->get_name(), nullptr);
                }
            } else {
                result.emplace_back(std::string(), std::move(expr));
            }
            if (consumeToken(",").empty()) {
              if (consumeToken(")").empty()) {
                throw std::runtime_error("Expected closing parenthesis in call args");
              }
              return result;
            }
        }
        throw std::runtime_error("Expected closing parenthesis in call args");
    }